

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationFractionalSpacingTests.cpp
# Opt level: O2

TestStatus *
vkt::tessellation::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,SpacingMode spacingMode)

{
  ostringstream *poVar1;
  VkDeviceSize bufferSize;
  void **ppvVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  Location LVar4;
  int *piVar5;
  _Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp;
  _Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp_00;
  _Val_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp_01;
  _Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp_02;
  bool bVar6;
  pointer pfVar7;
  size_type sVar8;
  Allocation *pAVar9;
  pointer pSVar10;
  pointer pSVar11;
  deUint32 queueFamilyIndex;
  uint uVar12;
  int iVar13;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice pVVar14;
  VkQueue queue;
  Allocator *allocator;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> _Var15;
  DescriptorSetLayoutBuilder *pDVar16;
  DescriptorPoolBuilder *pDVar17;
  DescriptorSetUpdateBuilder *pDVar18;
  ProgramBinary *pPVar19;
  GraphicsPipelineBuilder *pGVar20;
  pointer pLVar21;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  *p_Var22;
  MessageBuilder *pMVar23;
  pointer __p;
  pointer pLVar24;
  pointer pLVar25;
  pointer pfVar26;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  __first;
  ulong uVar27;
  pointer pfVar28;
  long lVar29;
  Segment extraout_RDX;
  Segment __n;
  int i;
  int iVar30;
  long lVar31;
  pointer pLVar32;
  float *value;
  int i_1;
  uint uVar33;
  VkBufferMemoryBarrier *__n_00;
  char *pcVar34;
  vector<float,_std::allocator<float>_> *this;
  ostringstream *this_00;
  VkDeviceSize VVar35;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  __i;
  pointer pLVar36;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  _Var37;
  int rangeNdx;
  long lVar38;
  pointer pLVar39;
  long lVar40;
  size_type __n_01;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  *this_01;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
  *this_02;
  LineData *value_00;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined4 uVar45;
  undefined4 in_stack_fffffffffffff830;
  SpacingMode mode;
  SpacingMode mode_00;
  vector<float,_std::allocator<float>_> result_2;
  vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  segmentsB;
  int additionalSegmentLocation;
  float additionalSegmentLength;
  string local_748;
  vector<float,_std::allocator<float>_> tessLevelCases;
  vector<float,_std::allocator<float>_> sortedCoords;
  float local_6e4;
  vector<float,_std::allocator<float>_> resultTessCoords;
  RefBase<vk::VkCommandBuffer_s_*> local_6c8;
  size_type local_6a0;
  vector<float,_std::allocator<float>_> additionalSegmentLengths;
  VkBufferMemoryBarrier shaderWriteBarrier;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_4e8;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_4c8;
  vector<int,_std::allocator<int>_> additionalSegmentLocations;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_488;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_468;
  VkDescriptorBufferInfo resultBufferInfo;
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_418;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_3f8;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_3d8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_3b8;
  Buffer resultBuffer;
  undefined1 local_368 [8];
  pointer pVStack_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358 [23];
  Buffer tessLevelsBuffer;
  string failNote;
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,9);
  vk = Context::getDeviceInterface(context);
  pVVar14 = Context::getDevice(context);
  fVar42 = SUB84(pVVar14,0);
  uVar45 = (undefined4)((ulong)pVVar14 >> 0x20);
  queue = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
    fVar41 = (float)(&tessellation::(anonymous_namespace)::genTessLevelCases()::rangeStarts)[lVar38]
    ;
    for (iVar30 = 0; iVar30 != 10; iVar30 = iVar30 + 1) {
      shaderWriteBarrier.sType = (VkStructureType)((float)iVar30 / 10.0 + fVar41);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&tessLevelCases,(float *)&shaderWriteBarrier);
    }
  }
  mode = spacingMode;
  for (iVar30 = 0; iVar30 != 0x3f; iVar30 = iVar30 + 1) {
    shaderWriteBarrier.sType = (VkStructureType)((float)iVar30 + 0.3);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&tessLevelCases,(float *)&shaderWriteBarrier);
  }
  _Var15 = std::
           __max_element<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  iVar30 = getClampedRoundedTessLevel(spacingMode,*_Var15._M_current);
  bufferSize = (long)(iVar30 + 1) * 4 + 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,bufferSize,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,(VkDevice)CONCAT44(uVar45,fVar42),allocator,
             (VkBufferCreateInfo *)&shaderWriteBarrier,(MemoryRequirement)0x1);
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,4,0x20);
  tessellation::Buffer::Buffer
            (&tessLevelsBuffer,vk,(VkDevice)CONCAT44(uVar45,fVar42),allocator,
             (VkBufferCreateInfo *)&shaderWriteBarrier,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier);
  pDVar16 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  pDVar16 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar16,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,4);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_368,pDVar16,vk,
             (VkDevice)CONCAT44(uVar45,fVar42),0);
  local_468.m_data.deleter.m_device = (VkDevice)local_358[0]._0_8_;
  local_468.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_358[0]._8_8_;
  local_468.m_data.object.m_internal = (deUint64)local_368;
  local_468.m_data.deleter.m_deviceIface = (DeviceInterface *)pVStack_360;
  local_368._0_4_ = 0;
  local_368._4_4_ = 0;
  pVStack_360 = (pointer)0x0;
  local_358[0]._M_allocated_capacity = (pointer)0x0;
  local_358[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_368);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_368);
  pDVar17 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_368,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar17 = ::vk::DescriptorPoolBuilder::addType(pDVar17,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&shaderWriteBarrier,pDVar17,vk,
             (VkDevice)CONCAT44(uVar45,fVar42),1,1);
  local_3b8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_3b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_3b8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_3b8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&shaderWriteBarrier);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )local_368);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&shaderWriteBarrier,vk,
                    (VkDevice)CONCAT44(uVar45,fVar42),
                    (VkDescriptorPool)local_3b8.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_468.m_data.object.m_internal);
  local_4c8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_4c8.m_data.deleter.m_pool.m_internal._0_4_ = shaderWriteBarrier.srcQueueFamilyIndex;
  local_4c8.m_data.deleter.m_pool.m_internal._4_4_ = shaderWriteBarrier.dstQueueFamilyIndex;
  local_4c8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_4c8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&shaderWriteBarrier);
  tessLevelsBufferInfo.buffer.m_internal =
       tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  tessLevelsBufferInfo.offset = 0;
  tessLevelsBufferInfo.range = 4;
  resultBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier);
  local_368._0_4_ = 0;
  local_368._4_4_ = 0;
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier,
                       (VkDescriptorSet)local_4c8.m_data.object.m_internal,(Location *)local_368,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&tessLevelsBufferInfo);
  failNote._M_dataplus._M_p = (pointer)0x1;
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar18,(VkDescriptorSet)local_4c8.m_data.object.m_internal,
                       (Location *)&failNote,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&resultBufferInfo);
  pVVar14 = (VkDevice)CONCAT44(uVar45,fVar42);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar18,vk,pVVar14);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&shaderWriteBarrier,vk,pVVar14);
  local_4e8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_4e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_4e8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_4e8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&shaderWriteBarrier);
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&shaderWriteBarrier,vk,pVVar14,
             (VkRenderPass)local_4e8.m_data.object.m_internal);
  local_3d8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_3d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_3d8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_3d8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&shaderWriteBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier,vk,pVVar14,
                     (VkDescriptorSetLayout)local_468.m_data.object.m_internal);
  local_488.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_488.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_488.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_488.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier,vk,pVVar14,
                  queueFamilyIndex);
  local_3f8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_3f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_3f8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_3f8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier,vk,pVVar14,
             (VkCommandPool)local_3f8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_6c8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_6c8.m_data.deleter.m_pool.m_internal._0_4_ = shaderWriteBarrier.srcQueueFamilyIndex;
  local_6c8.m_data.deleter.m_pool.m_internal._4_4_ = shaderWriteBarrier.dstQueueFamilyIndex;
  local_6c8.m_data.object = (VkCommandBuffer_s *)shaderWriteBarrier._0_8_;
  local_6c8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier);
  memset(&shaderWriteBarrier,0,0xfc);
  pPVar3 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&failNote,"vert",(allocator<char> *)&sortedCoords);
  pPVar19 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&failNote);
  pGVar20 = GraphicsPipelineBuilder::setShader
                      ((GraphicsPipelineBuilder *)&shaderWriteBarrier,vk,
                       (VkDevice)CONCAT44(uVar45,fVar42),VK_SHADER_STAGE_VERTEX_BIT,pPVar19,
                       (VkSpecializationInfo *)0x0);
  pPVar3 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"tesc",(allocator<char> *)&segmentsB);
  pPVar19 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_748);
  pGVar20 = GraphicsPipelineBuilder::setShader
                      (pGVar20,vk,(VkDevice)CONCAT44(uVar45,fVar42),
                       VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar19,(VkSpecializationInfo *)0x0)
  ;
  pPVar3 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result_2,"tese",(allocator<char> *)&additionalSegmentLengths);
  pPVar19 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&result_2);
  pGVar20 = GraphicsPipelineBuilder::setShader
                      (pGVar20,vk,(VkDevice)CONCAT44(uVar45,fVar42),
                       VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar19,
                       (VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_368,pGVar20,vk,
             (VkDevice)CONCAT44(uVar45,fVar42),(VkPipelineLayout)local_488.m_data.object.m_internal,
             (VkRenderPass)local_4e8.m_data.object.m_internal);
  local_418.m_data.deleter.m_device = (VkDevice)local_358[0]._0_8_;
  local_418.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_358[0]._8_8_;
  local_418.m_data.object.m_internal = (deUint64)local_368;
  local_418.m_data.deleter.m_deviceIface = (DeviceInterface *)pVStack_360;
  local_368._0_4_ = 0;
  local_368._4_4_ = 0;
  pVStack_360 = (pointer)0x0;
  local_358[0]._M_allocated_capacity = (pointer)0x0;
  local_358[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_368);
  std::__cxx11::string::~string((string *)&result_2);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&failNote);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&shaderWriteBarrier);
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar33 = 0;
  bVar6 = false;
  while( true ) {
    pLVar21 = (pointer)(ulong)uVar33;
    pVVar14 = (VkDevice)CONCAT44(uVar45,fVar42);
    if ((pointer)((long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= pLVar21) break;
    *(float *)(tessLevelsBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
              m_hostPtr =
         tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[(long)pLVar21];
    ::vk::flushMappedMemoryRange
              (vk,pVVar14,
               (VkDeviceMemory)
               ((tessLevelsBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (tessLevelsBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,4);
    pAVar9 = resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    memset((resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr,0,bufferSize);
    ::vk::flushMappedMemoryRange
              (vk,pVVar14,(VkDeviceMemory)(pAVar9->m_memory).m_internal,pAVar9->m_offset,bufferSize)
    ;
    beginCommandBuffer(vk,local_6c8.m_data.object);
    beginRenderPassWithRasterizationDisabled
              (vk,local_6c8.m_data.object,(VkRenderPass)local_4e8.m_data.object.m_internal,
               (VkFramebuffer)local_3d8.m_data.object.m_internal);
    (*vk->_vptr_DeviceInterface[0x4c])
              (vk,local_6c8.m_data.object,0,local_418.m_data.object.m_internal);
    (*vk->_vptr_DeviceInterface[0x56])
              (vk,local_6c8.m_data.object,0,local_488.m_data.object.m_internal,0,1,&local_4c8,0,0);
    (*vk->_vptr_DeviceInterface[0x59])(vk,local_6c8.m_data.object,1,1,0,0);
    endRenderPass(vk,local_6c8.m_data.object);
    makeBufferMemoryBarrier
              (&shaderWriteBarrier,0x40,0x2000,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,0,bufferSize);
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,local_6c8.m_data.object,0x8000,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
    endCommandBuffer(vk,local_6c8.m_data.object);
    submitCommandsAndWait(vk,(VkDevice)CONCAT44(uVar45,fVar42),queue,local_6c8.m_data.object);
    pAVar9 = resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    LVar4 = (Location)context->m_testCtx->m_log;
    VVar35 = bufferSize;
    ::vk::invalidateMappedMemoryRange
              (vk,(VkDevice)CONCAT44(uVar45,fVar42),
               (VkDeviceMemory)
               ((resultBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,bufferSize);
    iVar30 = (int)VVar35;
    piVar5 = (int *)pAVar9->m_hostPtr;
    __n_01 = (size_type)*piVar5;
    std::vector<float,_std::allocator<float>_>::vector
              (&resultTessCoords,__n_01,(allocator_type *)&shaderWriteBarrier);
    memcpy(resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start,piVar5 + 1,__n_01 << 2);
    local_6e4 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pLVar21];
    fVar41 = getClampedTessLevel(mode,local_6e4);
    uVar12 = getRoundedTessLevel(mode,fVar41);
    std::vector<float,_std::allocator<float>_>::vector(&sortedCoords,&resultTessCoords);
    std::
    __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish);
    de::toString<float>(&local_748,&local_6e4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                   "Note: tessellation level is ",&local_748);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shaderWriteBarrier,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                   "\nNote: sorted coordinates are:\n    ");
    containerStr<std::vector<float,std::allocator<float>>>
              ((string *)&result_2,(tessellation *)&sortedCoords,
               (vector<float,_std::allocator<float>_> *)0x0,0,iVar30);
    __n_00 = &shaderWriteBarrier;
    std::operator+(&failNote,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shaderWriteBarrier,(string *)&result_2);
    std::__cxx11::string::~string((string *)&result_2);
    std::__cxx11::string::~string((string *)&shaderWriteBarrier);
    std::__cxx11::string::~string((string *)local_368);
    std::__cxx11::string::~string((string *)&local_748);
    if (uVar12 + 1 !=
        (int)((ulong)((long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2)) {
      local_368 = (undefined1  [8])LVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_360);
      std::operator<<((ostream *)&pVStack_360,"Failure: number of vertices is ");
      std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_360);
      std::operator<<((ostream *)&pVStack_360,"; expected ");
      std::ostream::operator<<((ostringstream *)&pVStack_360,uVar12 + 1);
      std::operator<<((ostream *)&pVStack_360," (clamped tessellation level is ");
      std::ostream::operator<<((ostringstream *)&pVStack_360,fVar41);
      std::operator<<((ostream *)&pVStack_360,")");
      std::operator<<((ostream *)&pVStack_360,"; final level (clamped level rounded up to ");
      pcVar34 = "odd";
      if (mode == SPACINGMODE_FRACTIONAL_EVEN) {
        pcVar34 = "even";
      }
      std::operator<<((ostream *)&pVStack_360,pcVar34);
      std::operator<<((ostream *)&pVStack_360,") is ");
      std::ostream::operator<<((ostringstream *)&pVStack_360,uVar12);
      std::operator<<((ostream *)&pVStack_360,
                      " and should equal the number of segments, i.e. number of vertices minus 1");
      shaderWriteBarrier._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::operator<<((ostream *)&shaderWriteBarrier.pNext,(string *)&failNote);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
LAB_00700712:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_360);
      std::__cxx11::string::~string((string *)&failNote);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&sortedCoords.super__Vector_base<float,_std::allocator<float>_>);
LAB_0070073c:
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&resultTessCoords.super__Vector_base<float,_std::allocator<float>_>);
      goto LAB_00700749;
    }
    if ((((*sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0.0) ||
         (NAN(*sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start))) ||
        (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish[-1] != 1.0)) ||
       (NAN(sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      local_368 = (undefined1  [8])LVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_360);
      std::operator<<((ostream *)&pVStack_360,
                      "Failure: smallest coordinate should be 0.0 and biggest should be 1.0");
      shaderWriteBarrier._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::operator<<((ostream *)&shaderWriteBarrier.pNext,(string *)&failNote);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      goto LAB_00700712;
    }
    if ((int)uVar12 < 0) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    this_01 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
               *)(long)(int)uVar12;
    pLVar21 = (pointer)std::
                       _Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                       ::_M_allocate(this_01,(size_t)__n_00);
    local_748.field_2._M_allocated_capacity = (size_type)(&pLVar21->tessLevel + (long)this_01 * 2);
    lVar40 = 0;
    lVar38 = 0;
    for (p_Var22 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    *)0x0; this_01 != p_Var22;
        p_Var22 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                   *)((long)&(p_Var22->_M_impl).super__Vector_impl_data._M_start + 1)) {
      *(undefined8 *)(&pLVar21->tessLevel + (long)p_Var22 * 2) = 0xbf800000ffffffff;
      lVar38 = lVar38 + -8;
      lVar40 = lVar40 + 0x100000000;
    }
    local_748._M_string_length = (long)pLVar21 - lVar38;
    for (uVar27 = 0; uVar12 != uVar27; uVar27 = uVar27 + 1) {
      fVar44 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar27 + 1];
      fVar43 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar27];
      (&pLVar21->tessLevel)[uVar27 * 2] = (float)uVar27;
      (&pLVar21->additionalSegmentLength)[uVar27 * 2] = fVar44 - fVar43;
    }
    local_6a0 = -lVar38 >> 3;
    local_748._M_dataplus._M_p = (pointer)pLVar21;
    std::vector<float,_std::allocator<float>_>::vector
              (&result_2,local_6a0,(allocator_type *)&segmentsB);
    lVar40 = lVar40 >> 0x20;
    lVar31 = 0;
    if (0 < lVar40) {
      lVar31 = lVar40;
    }
    for (lVar29 = 0; lVar31 != lVar29; lVar29 = lVar29 + 1) {
      result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar29] = (&pLVar21->additionalSegmentLength)[lVar29 * 2];
    }
    containerStr<std::vector<float,std::allocator<float>>>
              ((string *)local_368,(tessellation *)&result_2,
               (vector<float,_std::allocator<float>_> *)0x0,0,iVar30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shaderWriteBarrier,"\nNote: segment lengths are, from left to right:\n    ",
                   (string *)local_368);
    std::__cxx11::string::append((string *)&failNote);
    std::__cxx11::string::~string((string *)&shaderWriteBarrier);
    std::__cxx11::string::~string((string *)local_368);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&result_2.super__Vector_base<float,_std::allocator<float>_>);
    result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    segmentsB.
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    segmentsB.
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    segmentsB.
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
    ::push_back((vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                 *)&result_2.super__Vector_base<float,_std::allocator<float>_>,(value_type *)pLVar21
               );
    pLVar32 = pLVar21 + 1;
    for (lVar31 = 1;
        pSVar10 = segmentsB.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pfVar7 = result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
        pfVar28 = result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        pfVar26 = result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start, lVar31 < lVar40; lVar31 = lVar31 + 1) {
      fVar43 = pLVar32->tessLevel -
               result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      fVar44 = -fVar43;
      if (-fVar43 <= fVar43) {
        fVar44 = fVar43;
      }
      this = &result_2;
      if ((0.001 <= fVar44) &&
         (this = (vector<float,_std::allocator<float>_> *)&segmentsB,
         segmentsB.
         super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         segmentsB.
         super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        fVar43 = pLVar32->tessLevel -
                 (segmentsB.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start)->length;
        fVar44 = -fVar43;
        if (-fVar43 <= fVar43) {
          fVar44 = fVar43;
        }
        if (0.001 <= fVar44) {
          local_368 = (undefined1  [8])LVar4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_360);
          std::operator<<((ostream *)&pVStack_360,
                          "Failure: couldn\'t divide segments to 2 groups by length; ");
          std::operator<<((ostream *)&pVStack_360,"e.g. segment of length ");
          pMVar23 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_368,&pLVar32->tessLevel)
          ;
          std::operator<<((ostream *)&pMVar23->m_str," isn\'t approximately equal to either ");
          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,pfVar26 + 1);
          std::operator<<((ostream *)&pMVar23->m_str," or ");
          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&pSVar10->length);
          shaderWriteBarrier._0_8_ =
               tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage)
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
          std::operator<<((ostream *)&shaderWriteBarrier.pNext,(string *)&failNote);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_007000b7;
        }
      }
      std::
      vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
      ::push_back((vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                   *)this,(value_type *)&pLVar32[-1].additionalSegmentLocation);
      pLVar32 = (pointer)&pLVar32->additionalSegmentLocation;
    }
    if ((result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start ==
         result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish || fVar41 != (float)(int)uVar12) ||
       (segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      if ((result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start !=
           result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (segmentsB.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          segmentsB.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        if (((long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10) ||
           ((long)segmentsB.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)segmentsB.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x10)) {
          if ((long)segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x10) {
            result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)segmentsB.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)segmentsB.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)segmentsB.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            segmentsB.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar26;
            segmentsB.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)pfVar28;
            segmentsB.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pfVar7;
          }
          pfVar26 = result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pSVar10 = (pointer)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start;
          pSVar11 = (pointer)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish;
          if ((long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x10) {
            if (result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[1] <
                (segmentsB.
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length) {
              result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)segmentsB.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pfVar26;
              pSVar10 = segmentsB.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pSVar11 = segmentsB.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start;
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish;
            }
          }
          else if (result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[1] + 0.001 <
                   (segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start)->length) {
            local_368 = (undefined1  [8])LVar4;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_360);
            std::operator<<((ostream *)&pVStack_360,
                            "Failure: the two additional segments are longer than the other segments"
                           );
            shaderWriteBarrier._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
            std::operator<<((ostream *)&shaderWriteBarrier.pNext,(string *)&failNote);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&shaderWriteBarrier,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_007000b7;
          }
          result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)pSVar11;
          result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)pSVar10;
          pSVar10 = segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar30 = (segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start)->index;
          iVar13 = segmentsB.
                   super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].index;
          if (iVar30 + iVar13 + 1 == (int)local_6a0) {
            additionalSegmentLength =
                 (segmentsB.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start)->length;
            if ((((long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start != 0x10) ||
                (additionalSegmentLocation = -1,
                additionalSegmentLength <
                result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[1] + -0.001)) &&
               (additionalSegmentLocation = iVar13, iVar30 < iVar13)) {
              additionalSegmentLocation = iVar30;
            }
            bVar6 = true;
            goto LAB_007000d3;
          }
          local_368 = (undefined1  [8])LVar4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_360);
          std::operator<<((ostream *)&pVStack_360,
                          "Failure: the two additional segments aren\'t placed symmetrically; ");
          std::operator<<((ostream *)&pVStack_360,"one is at index ");
          pMVar23 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_368,&pSVar10->index);
          std::operator<<((ostream *)&pMVar23->m_str," and other is at index ");
          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&pSVar10[1].index);
          poVar1 = &pMVar23->m_str;
          std::operator<<((ostream *)poVar1," (note: the two indexes should sum to ");
          std::ostream::operator<<(poVar1,(int)local_6a0 + -1);
          std::operator<<((ostream *)poVar1,", i.e. numberOfSegments-1)");
          shaderWriteBarrier._0_8_ =
               tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage)
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
          std::operator<<((ostream *)&shaderWriteBarrier.pNext,(string *)&failNote);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_368 = (undefined1  [8])LVar4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_360);
          std::operator<<((ostream *)&pVStack_360,
                          "Failure: when dividing the segments to 2 groups by length, neither of the two groups has exactly 2 or 0 segments in it"
                         );
          shaderWriteBarrier._0_8_ =
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
          std::operator<<((ostream *)&shaderWriteBarrier.pNext,(string *)&failNote);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        goto LAB_007000b7;
      }
      additionalSegmentLength = -1.0;
      if (lVar38 != -8) {
        additionalSegmentLength = pLVar21->additionalSegmentLength;
      }
      additionalSegmentLocation = -1;
      bVar6 = true;
    }
    else {
      local_368 = (undefined1  [8])LVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_360);
      std::operator<<((ostream *)&pVStack_360,
                      "Failure: clamped and final tessellation level are equal, but not all segments are of equal length."
                     );
      shaderWriteBarrier._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::operator<<((ostream *)&shaderWriteBarrier.pNext,(string *)&failNote);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
LAB_007000b7:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_360);
      bVar6 = false;
    }
LAB_007000d3:
    std::
    vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
    ::~vector(&segmentsB);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
    ::~vector((vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
               *)&result_2);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
    ::~vector((vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
               *)&local_748);
    std::__cxx11::string::~string((string *)&failNote);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&sortedCoords.super__Vector_base<float,_std::allocator<float>_>);
    if (!bVar6) goto LAB_0070073c;
    std::vector<float,_std::allocator<float>_>::push_back
              (&additionalSegmentLengths,&additionalSegmentLength);
    std::vector<int,_std::allocator<int>_>::push_back
              (&additionalSegmentLocations,&additionalSegmentLocation);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&resultTessCoords.super__Vector_base<float,_std::allocator<float>_>);
    uVar33 = uVar33 + 1;
    bVar6 = true;
  }
  if (bVar6) {
    LVar4 = (Location)context->m_testCtx->m_log;
    local_748._M_dataplus._M_p = (pointer)0x0;
    local_748._M_string_length = 0;
    local_748.field_2._M_allocated_capacity = 0;
    pLVar36 = (pointer)0x0;
    pfVar26 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar28 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pLVar32 = (pointer)0x0;
    for (lVar38 = 0; sVar8 = local_748._M_string_length,
        lVar38 < (int)((ulong)((long)pfVar28 - (long)pfVar26) >> 2); lVar38 = lVar38 + 1) {
      fVar41 = pfVar26[lVar38];
      fVar44 = additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar38];
      iVar30 = additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar38];
      if ((pointer)local_748._M_string_length == pLVar36) {
        lVar40 = (long)pLVar36 - (long)pLVar32;
        if (lVar40 == 0x7ffffffffffffff8) {
          local_748._M_dataplus._M_p = (pointer)pLVar32;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)(lVar40 / 0xc);
        pLVar25 = __p;
        if (pLVar36 == pLVar32) {
          pLVar25 = (pointer)0x1;
        }
        this_02 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                   *)((long)&__p->tessLevel + (long)&pLVar25->tessLevel);
        if ((_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
             *)0xaaaaaaaaaaaaaa9 < this_02) {
          this_02 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                     *)0xaaaaaaaaaaaaaaa;
        }
        if (CARRY8((ulong)pLVar25,(ulong)__p)) {
          this_02 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                     *)0xaaaaaaaaaaaaaaa;
        }
        pLVar24 = std::
                  _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                  ::_M_allocate(this_02,(size_t)pLVar21);
        *(float *)((long)pLVar24 + lVar40) = fVar41;
        *(float *)((long)pLVar24 + lVar40 + 4) = fVar44;
        *(int *)((long)pLVar24 + lVar40 + 8) = iVar30;
        __n = extraout_RDX;
        pLVar21 = pLVar24;
        for (pLVar25 = pLVar32; pLVar39 = pLVar21 + 1, pLVar25 != pLVar36; pLVar25 = pLVar25 + 1) {
          pLVar21->additionalSegmentLocation = pLVar25->additionalSegmentLocation;
          __n.index = (int)pLVar25->tessLevel;
          __n.length = pLVar25->additionalSegmentLength;
          pLVar21->tessLevel = (float)__n.index;
          pLVar21->additionalSegmentLength = __n.length;
          pLVar21 = pLVar39;
        }
        std::
        _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
        ::_M_deallocate((_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                         *)pLVar32,__p,(size_t)__n);
        pLVar36 = pLVar24 + (long)this_02;
        pfVar26 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar28 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_748.field_2._M_allocated_capacity = (size_type)pLVar36;
      }
      else {
        *(float *)local_748._M_string_length = fVar41;
        *(float *)(local_748._M_string_length + 4) = fVar44;
        *(int *)(local_748._M_string_length + 8) = iVar30;
        pLVar39 = (pointer)(local_748._M_string_length + 0xc);
        pLVar24 = pLVar32;
        __p = pLVar21;
        fVar44 = fVar42;
      }
      pLVar32 = pLVar24;
      pLVar21 = __p;
      fVar42 = fVar44;
      local_748._M_string_length = (size_type)pLVar39;
    }
    lVar38 = local_748._M_string_length - (long)pLVar32;
    local_748._M_dataplus._M_p = (pointer)pLVar32;
    __first._M_current =
         std::
         _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
         ::_M_allocate((_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                        *)(lVar38 / 0xc),(size_t)pLVar21);
    result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(lVar38 + (long)__first._M_current);
    lVar38 = 0;
    while( true ) {
      pLVar21 = (pointer)((long)&pLVar32->tessLevel + lVar38);
      _Var37._M_current = (LineData *)((long)&(__first._M_current)->tessLevel + lVar38);
      if (pLVar21 == (pointer)sVar8) break;
      (_Var37._M_current)->additionalSegmentLocation = pLVar21->additionalSegmentLocation;
      fVar41 = pLVar21->additionalSegmentLength;
      (_Var37._M_current)->tessLevel = pLVar21->tessLevel;
      (_Var37._M_current)->additionalSegmentLength = fVar41;
      lVar38 = lVar38 + 0xc;
    }
    uVar27 = lVar38 / 0xc;
    result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = &(__first._M_current)->tessLevel;
    result_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)_Var37._M_current;
    if (lVar38 != 0) {
      lVar40 = 0x3f;
      if (uVar27 != 0) {
        for (; uVar27 >> lVar40 == 0; lVar40 = lVar40 + -1) {
        }
      }
      __comp._M_comp.m_membP._4_4_ = uVar45;
      __comp._M_comp.m_membP._0_4_ = fVar42;
      __comp._M_comp._8_4_ = in_stack_fffffffffffff830;
      __comp._M_comp._12_4_ = mode;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                (__first,_Var37,(ulong)(((uint)lVar40 ^ 0x3f) * 2) ^ 0x7e,__comp);
      if (lVar38 < 0xc1) {
        __comp_02._M_comp.m_membP._4_4_ = uVar45;
        __comp_02._M_comp.m_membP._0_4_ = fVar42;
        __comp_02._M_comp._8_4_ = in_stack_fffffffffffff830;
        __comp_02._M_comp._12_4_ = mode;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                  (__first,_Var37,__comp_02);
      }
      else {
        _Var37._M_current = __first._M_current + 0x10;
        __comp_00._M_comp.m_membP._4_4_ = uVar45;
        __comp_00._M_comp.m_membP._0_4_ = fVar42;
        __comp_00._M_comp._8_4_ = in_stack_fffffffffffff830;
        __comp_00._M_comp._12_4_ = mode;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                  (__first,_Var37,__comp_00);
        for (lVar38 = lVar38 + -0xc0; lVar38 != 0; lVar38 = lVar38 + -0xc) {
          __comp_01._M_comp.m_membP._4_4_ = uVar45;
          __comp_01._M_comp.m_membP._0_4_ = fVar42;
          __comp_01._M_comp._8_4_ = in_stack_fffffffffffff830;
          __comp_01._M_comp._12_4_ = mode;
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,__gnu_cxx::__ops::_Val_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                    (_Var37,__comp_01);
          _Var37._M_current = _Var37._M_current + 1;
        }
      }
    }
    _Var37._M_current = __first._M_current;
    mode_00 = mode;
    for (lVar38 = 1; value_00 = _Var37._M_current + 1, lVar38 < (int)uVar27; lVar38 = lVar38 + 1) {
      if ((-1 < _Var37._M_current[1].additionalSegmentLocation) &&
         (-1 < (_Var37._M_current)->additionalSegmentLocation)) {
        fVar42 = getClampedTessLevel(mode,value_00->tessLevel);
        fVar41 = getClampedTessLevel(mode,(_Var37._M_current)->tessLevel);
        if ((fVar42 == fVar41) &&
           ((!NAN(fVar42) && !NAN(fVar41) &&
            (_Var37._M_current[1].additionalSegmentLocation !=
             (_Var37._M_current)->additionalSegmentLocation)))) {
          this_00 = (ostringstream *)&pVStack_360;
          local_368 = (undefined1  [8])LVar4;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,
                          "Failure: additional segments not located identically for two edges with identical clamped tessellation levels"
                         );
          shaderWriteBarrier._0_8_ =
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
          ppvVar2 = &shaderWriteBarrier.pNext;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
          std::operator<<((ostream *)ppvVar2,"Note: tessellation levels are ");
          pMVar23 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&shaderWriteBarrier,&value_00->tessLevel);
          std::operator<<((ostream *)&pMVar23->m_str," and ");
          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&(_Var37._M_current)->tessLevel);
          poVar1 = &pMVar23->m_str;
          std::operator<<((ostream *)poVar1," (clamped level ");
          fVar42 = getClampedTessLevel(mode_00,value_00->tessLevel);
          std::ostream::operator<<(poVar1,fVar42);
          std::operator<<((ostream *)poVar1,")");
          std::operator<<((ostream *)poVar1,"; but first additional segments located at indices ");
          pMVar23 = tcu::MessageBuilder::operator<<
                              (pMVar23,&_Var37._M_current[1].additionalSegmentLocation);
          std::operator<<((ostream *)&pMVar23->m_str," and ");
          pMVar23 = tcu::MessageBuilder::operator<<
                              (pMVar23,&(_Var37._M_current)->additionalSegmentLocation);
          std::operator<<((ostream *)&pMVar23->m_str,", respectively");
          tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
          goto LAB_00700d6a;
        }
      }
      _Var37._M_current = value_00;
    }
    value = &__first._M_current[1].additionalSegmentLength;
    lVar38 = 1;
LAB_007009a1:
    if (lVar38 < (int)uVar27) {
      if ((*value <= 0.0 && *value != 0.0) || (value[-3] <= 0.0 && value[-3] != 0.0))
      goto LAB_00700a2d;
      fVar42 = getClampedTessLevel(mode_00,((LineData *)(value + -1))->tessLevel);
      fVar41 = getClampedTessLevel(mode_00,value[-4]);
      iVar30 = getRoundedTessLevel(mode_00,fVar42);
      iVar13 = getRoundedTessLevel(mode_00,fVar41);
      if (iVar30 != iVar13) goto LAB_00700a2d;
      fVar44 = value[-3];
      fVar43 = *value;
      if (fVar44 <= fVar43) {
        if ((fVar42 == fVar41) && (!NAN(fVar42) && !NAN(fVar41))) {
          if ((fVar43 != fVar44) || (NAN(fVar43) || NAN(fVar44))) goto LAB_00700b79;
        }
        goto LAB_00700a2d;
      }
LAB_00700b79:
      failNote._M_dataplus._M_p = (pointer)LVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&failNote._M_string_length);
      std::operator<<((ostream *)&failNote._M_string_length,
                      "Failure: additional segment length isn\'t monotonically decreasing with the fraction <n> - <f>, among edges with same final tessellation level"
                     );
      local_368 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&failNote,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_360);
      std::operator<<((ostream *)&pVStack_360,
                      "Note: <f> stands for the clamped tessellation level and <n> for the final (rounded and clamped) tessellation level"
                     );
      shaderWriteBarrier._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
      ppvVar2 = &shaderWriteBarrier.pNext;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
      std::operator<<((ostream *)ppvVar2,"Note: two edges have tessellation levels ");
      pMVar23 = tcu::MessageBuilder::operator<<((MessageBuilder *)&shaderWriteBarrier,value + -4);
      std::operator<<((ostream *)&pMVar23->m_str," and ");
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(float *)(value + -1));
      poVar1 = &pMVar23->m_str;
      std::operator<<((ostream *)poVar1," respectively");
      std::operator<<((ostream *)poVar1,", clamped ");
      std::ostream::operator<<(poVar1,fVar41);
      std::operator<<((ostream *)poVar1," and ");
      std::ostream::operator<<(poVar1,fVar42);
      std::operator<<((ostream *)poVar1,", final ");
      std::ostream::operator<<(poVar1,iVar30);
      std::operator<<((ostream *)poVar1," and ");
      std::ostream::operator<<(poVar1,iVar30);
      std::operator<<((ostream *)poVar1,"; fractions are ");
      std::ostream::operator<<(poVar1,(float)iVar30 - fVar41);
      std::operator<<((ostream *)poVar1," and ");
      std::ostream::operator<<(poVar1,(float)iVar30 - fVar42);
      std::operator<<((ostream *)poVar1,", but resulted in segment lengths ");
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,value + -3);
      std::operator<<((ostream *)&pMVar23->m_str," and ");
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,value);
      tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_360);
      this_00 = (ostringstream *)&failNote._M_string_length;
LAB_00700d6a:
      std::__cxx11::ostringstream::~ostringstream(this_00);
      bVar6 = false;
    }
    else {
      bVar6 = true;
    }
    std::
    vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
    ::~vector((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
               *)&result_2);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
    ::~vector((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
               *)&local_748);
  }
  if (bVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderWriteBarrier,"OK",(allocator<char> *)local_368);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&shaderWriteBarrier);
  }
  else {
LAB_00700749:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderWriteBarrier,"Failure",(allocator<char> *)local_368);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&shaderWriteBarrier);
  }
  std::__cxx11::string::~string((string *)&shaderWriteBarrier);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_418);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_6c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_3f8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_488);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_3d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_4e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_4c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_3b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_468);
  tessellation::Buffer::~Buffer(&tessLevelsBuffer);
  tessellation::Buffer::~Buffer(&resultBuffer);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&tessLevelCases.super__Vector_base<float,_std::allocator<float>_>);
  return __return_storage_ptr__;
LAB_00700a2d:
  lVar38 = lVar38 + 1;
  value = value + 3;
  goto LAB_007009a1;
}

Assistant:

tcu::TestStatus test (Context& context, const SpacingMode spacingMode)
{
	DE_ASSERT(spacingMode == SPACINGMODE_FRACTIONAL_ODD || spacingMode == SPACINGMODE_FRACTIONAL_EVEN);

	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const std::vector<float>	tessLevelCases = genTessLevelCases();
	const int					maxNumVertices = 1 + getClampedRoundedTessLevel(spacingMode, *std::max_element(tessLevelCases.begin(), tessLevelCases.end()));

	// Result buffer: generated tess coords go here.

	const VkDeviceSize resultBufferSizeBytes = sizeof(int) + sizeof(float) * maxNumVertices;
	const Buffer	   resultBuffer			 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Outer1 tessellation level constant buffer.

	const VkDeviceSize tessLevelsBufferSizeBytes = sizeof(float);  // we pass only outer1
	const Buffer	   tessLevelsBuffer			 (vk, device, allocator, makeBufferCreateInfo(tessLevelsBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet			(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  tessLevelsBufferInfo	= makeDescriptorBufferInfo(tessLevelsBuffer.get(), 0ull, tessLevelsBufferSizeBytes);
	const VkDescriptorBufferInfo  resultBufferInfo		= makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkRenderPass>		renderPass	  (makeRenderPassWithoutAttachments	(vk, device));
	const Unique<VkFramebuffer>		framebuffer	  (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout				(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool		  (makeCommandPool					(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer	  (allocateCommandBuffer			(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL)
		.build(vk, device, *pipelineLayout, *renderPass));

	// Data that will be verified across all cases
	std::vector<float> additionalSegmentLengths;
	std::vector<int>   additionalSegmentLocations;

	bool success = false;

	// Repeat the test for all tessellation coords cases
	for (deUint32 tessLevelCaseNdx = 0; tessLevelCaseNdx < tessLevelCases.size(); ++tessLevelCaseNdx)
	{
		// Upload tessellation levels data to the input buffer
		{
			const Allocation& alloc			  = tessLevelsBuffer.getAllocation();
			float* const	  tessLevelOuter1 = static_cast<float*>(alloc.getHostPtr());

			*tessLevelOuter1 = tessLevelCases[tessLevelCaseNdx];
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), tessLevelsBufferSizeBytes);
		}

		// Clear the results buffer
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		beginCommandBuffer(vk, *cmdBuffer);

		// Begin render pass
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify the result.
		{
			tcu::TestLog& log = context.getTestContext().getLog();

			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32 numResults = *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<float> resultTessCoords = readFloatArray(numResults, resultAlloc.getHostPtr(), sizeof(deInt32));

			// Outputs
			float additionalSegmentLength;
			int   additionalSegmentLocation;

			success = verifyFractionalSpacingSingle(log, spacingMode, tessLevelCases[tessLevelCaseNdx], resultTessCoords,
													&additionalSegmentLength, &additionalSegmentLocation);

			if (!success)
				break;

			additionalSegmentLengths.push_back(additionalSegmentLength);
			additionalSegmentLocations.push_back(additionalSegmentLocation);
		}
	} // for tessLevelCaseNdx

	if (success)
		success = verifyFractionalSpacingMultiple(context.getTestContext().getLog(), spacingMode, tessLevelCases, additionalSegmentLengths, additionalSegmentLocations);

	return (success ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Failure"));
}